

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.h
# Opt level: O3

cmCommand * __thiscall
cmTargetIncludeDirectoriesCommand::Clone(cmTargetIncludeDirectoriesCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x78);
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->Makefile = (cmMakefile *)0x0;
  pcVar1->Enabled = true;
  pcVar1[1].super_cmObject._vptr_cmObject = (_func_int **)&pcVar1[1].Helper;
  pcVar1[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &pcVar1[1].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  (pcVar1->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmTargetPropCommandBase_005fd0e0;
  return pcVar1;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetIncludeDirectoriesCommand;
    }